

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editing_commands.cpp
# Opt level: O1

void redo_cmd_do_redo_proc(Am_Object *cmd)

{
  Am_Object_Method_Type *pAVar1;
  bool bVar2;
  Am_Value *pAVar3;
  Am_Object undo_handler;
  Am_Object last_command;
  Am_Object_Method method;
  Am_Object local_38;
  Am_Object local_30;
  Am_Object local_28;
  Am_Object local_20;
  Am_Object_Method local_18;
  
  local_38.data = (Am_Object_Data *)0x0;
  local_30.data = (Am_Object_Data *)0x0;
  Am_Object::Am_Object(&local_20,cmd);
  get_undo_handler_from_cmd((Am_Object *)&local_18);
  Am_Object::operator=(&local_38,(Am_Object *)&local_18);
  Am_Object::~Am_Object((Am_Object *)&local_18);
  Am_Object::~Am_Object(&local_20);
  bVar2 = Am_Object::Valid(&local_38);
  if (bVar2) {
    pAVar3 = Am_Object::Get(&local_38,0x179,0);
    Am_Object::operator=(&local_30,pAVar3);
    bVar2 = Am_Object::Valid(&local_30);
    if (bVar2) {
      local_18.from_wrapper = (Am_Method_Wrapper *)0x0;
      local_18.Call = (Am_Object_Method_Type *)0x0;
      pAVar3 = Am_Object::Get(&local_38,0x177,0);
      Am_Object_Method::operator=(&local_18,pAVar3);
      pAVar1 = local_18.Call;
      Am_Object::Am_Object(&local_28,&local_38);
      (*pAVar1)((Am_Object_Data *)&local_28);
      Am_Object::~Am_Object(&local_28);
    }
  }
  Am_Object::~Am_Object(&local_30);
  Am_Object::~Am_Object(&local_38);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, redo_cmd_do_redo, (Am_Object cmd))
{
  Am_Object undo_handler, last_command;
  undo_handler = get_undo_handler_from_cmd(cmd);
  if (undo_handler.Valid()) {
    last_command = undo_handler.Get(Am_REDO_ALLOWED);
    if (last_command.Valid()) {
      Am_Object_Method method;
      Am_INTER_TRACE_PRINT(Am_INTER_TRACE_SHORT, "Redo command "
                                                     << last_command);
      method = undo_handler.Get(Am_PERFORM_REDO);
      method.Call(undo_handler);
    }
  }
}